

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O1

void __thiscall
cmMakefileTargetGenerator::GenDefFile
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *real_link_commands)

{
  cmGeneratorTarget *this_00;
  pointer pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  cmMakefile *this_01;
  pointer pbVar3;
  pointer ppcVar4;
  int iVar5;
  ModuleDefinitionInfo *path;
  string *psVar6;
  ostream *poVar7;
  string *obj_1;
  pointer pbVar8;
  string *obj;
  pointer ppcVar9;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  string_view source;
  string_view source_00;
  string_view source_01;
  string_view source_02;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string cmd;
  string objlist_file;
  cmGeneratedFileStream fout;
  string local_378;
  value_type local_358;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_338;
  string local_330;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  char *local_278;
  undefined8 local_270;
  size_type local_268;
  pointer local_260;
  string *local_258;
  undefined8 local_250;
  undefined1 *local_248;
  undefined8 local_240;
  
  this_00 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  GetConfigName_abi_cxx11_((string *)local_298,this);
  path = cmGeneratorTarget::GetModuleDefinitionInfo(this_00,(string *)local_298);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._0_8_ != &local_288) {
    operator_delete((void *)local_298._0_8_,local_288._M_allocated_capacity + 1);
  }
  if ((path != (ModuleDefinitionInfo *)0x0) && (path->DefFileGenerated != false)) {
    local_338 = real_link_commands;
    psVar6 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    pcVar1 = (psVar6->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_358,pcVar1,pcVar1 + psVar6->_M_string_length);
    source._M_str = local_358._M_dataplus._M_p;
    source._M_len = local_358._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_2b8,(cmOutputConverter *)this->LocalGenerator,source,SHELL,false);
    pcVar2 = this->LocalGenerator;
    cmOutputConverter::MaybeRelativeToCurBinDir
              (&local_2f8,(cmOutputConverter *)pcVar2,&path->DefFile);
    source_00._M_str = local_2f8._M_dataplus._M_p;
    source_00._M_len = local_2f8._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              (&local_2d8,(cmOutputConverter *)pcVar2,source_00,SHELL,false);
    local_298._0_8_ = local_2b8._M_string_length;
    local_298._8_8_ = local_2b8._M_dataplus._M_p;
    local_288._8_8_ = 0x11;
    local_278 = " -E __create_def ";
    local_270 = 0;
    local_268 = local_2d8._M_string_length;
    local_260 = local_2d8._M_dataplus._M_p;
    local_330.field_2._M_allocated_capacity = (long)&local_330.field_2 + 8;
    local_330._M_dataplus._M_p = (pointer)0x0;
    local_330._M_string_length = 1;
    local_330.field_2._M_local_buf[8] = ' ';
    local_250 = 1;
    local_240 = 0;
    views._M_len = 4;
    views._M_array = (iterator)local_298;
    local_288._M_allocated_capacity = (size_type)&local_2b8;
    local_258 = &local_2d8;
    local_248 = (undefined1 *)local_330.field_2._M_allocated_capacity;
    cmCatViews(&local_378,views);
    std::__cxx11::string::operator=((string *)&local_358,(string *)&local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
      operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    pcVar1 = (path->DefFile)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_330,pcVar1,pcVar1 + (path->DefFile)._M_string_length);
    std::__cxx11::string::append((char *)&local_330);
    pcVar2 = this->LocalGenerator;
    cmOutputConverter::MaybeRelativeToCurBinDir(&local_378,(cmOutputConverter *)pcVar2,&local_330);
    source_01._M_str = local_378._M_dataplus._M_p;
    source_01._M_len = local_378._M_string_length;
    cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
              ((string *)local_298,(cmOutputConverter *)pcVar2,source_01,SHELL,false);
    std::__cxx11::string::_M_append((char *)&local_358,local_298._0_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    this_01 = (this->super_cmCommonTargetGenerator).Makefile;
    local_298._0_8_ = &local_288;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"CMAKE_NM","");
    psVar6 = (string *)cmMakefile::GetDefinition(this_01,(string *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_allocated_capacity + 1));
    }
    if ((psVar6 != (string *)0x0) && (psVar6->_M_string_length != 0)) {
      std::__cxx11::string::append((char *)&local_358);
      if (psVar6 == (string *)0x0) {
        psVar6 = &cmValue::Empty_abi_cxx11_;
      }
      source_02._M_str = (psVar6->_M_dataplus)._M_p;
      source_02._M_len = psVar6->_M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                ((string *)local_298,
                 (cmOutputConverter *)(this->super_cmCommonTargetGenerator).LocalCommonGenerator,
                 source_02,SHELL,false);
      std::__cxx11::string::_M_append((char *)&local_358,local_298._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._0_8_ != &local_288) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_288._M_allocated_capacity + 1));
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(local_338,
             (local_338->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,&local_358);
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_298,&local_330,false,None);
    if (path->WindowsExportAllSymbols == true) {
      pbVar3 = (this->Objects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar8 = (this->Objects).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar3; pbVar8 = pbVar8 + 1
          ) {
        local_378._M_string_length = (size_type)(pbVar8->_M_dataplus)._M_p;
        local_378._M_dataplus._M_p = (pointer)pbVar8->_M_string_length;
        if (((char *)0x3 < local_378._M_dataplus._M_p) &&
           (__str._M_str = ".obj", __str._M_len = 4,
           iVar5 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                             ((basic_string_view<char,_std::char_traits<char>_> *)&local_378,
                              (size_type)(local_378._M_dataplus._M_p + -4),4,__str), iVar5 == 0)) {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,(pbVar8->_M_dataplus)._M_p,
                              pbVar8->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        }
      }
      pbVar8 = (this->ExternalObjects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (this->ExternalObjects).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar8 != pbVar3) {
        do {
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_298,(pbVar8->_M_dataplus)._M_p,
                              pbVar8->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
          pbVar8 = pbVar8 + 1;
        } while (pbVar8 != pbVar3);
      }
    }
    ppcVar9 = (path->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppcVar4 = (path->Sources).
              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppcVar9 != ppcVar4) {
      do {
        psVar6 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar9);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_298,(psVar6->_M_dataplus)._M_p,psVar6->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
        ppcVar9 = ppcVar9 + 1;
      } while (ppcVar9 != ppcVar4);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,
                      (ulong)(local_330.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmMakefileTargetGenerator::GenDefFile(
  std::vector<std::string>& real_link_commands)
{
  cmGeneratorTarget::ModuleDefinitionInfo const* mdi =
    this->GeneratorTarget->GetModuleDefinitionInfo(this->GetConfigName());
  if (!mdi || !mdi->DefFileGenerated) {
    return;
  }
  std::string cmd = cmSystemTools::GetCMakeCommand();
  cmd = cmStrCat(
    this->LocalGenerator->ConvertToOutputFormat(cmd, cmOutputConverter::SHELL),
    " -E __create_def ",
    this->LocalGenerator->ConvertToOutputFormat(
      this->LocalGenerator->MaybeRelativeToCurBinDir(mdi->DefFile),
      cmOutputConverter::SHELL),
    ' ');
  std::string objlist_file = mdi->DefFile + ".objs";
  cmd += this->LocalGenerator->ConvertToOutputFormat(
    this->LocalGenerator->MaybeRelativeToCurBinDir(objlist_file),
    cmOutputConverter::SHELL);
  cmValue const nm_executable = this->Makefile->GetDefinition("CMAKE_NM");
  if (cmNonempty(nm_executable)) {
    cmd += " --nm=";
    cmd += this->LocalCommonGenerator->ConvertToOutputFormat(
      *nm_executable, cmOutputConverter::SHELL);
  }
  real_link_commands.insert(real_link_commands.begin(), cmd);
  // create a list of obj files for the -E __create_def to read
  cmGeneratedFileStream fout(objlist_file);

  if (mdi->WindowsExportAllSymbols) {
    for (std::string const& obj : this->Objects) {
      if (cmHasLiteralSuffix(obj, ".obj")) {
        fout << obj << "\n";
      }
    }
    for (std::string const& obj : this->ExternalObjects) {
      fout << obj << "\n";
    }
  }

  for (cmSourceFile const* src : mdi->Sources) {
    fout << src->GetFullPath() << "\n";
  }
}